

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O1

void __thiscall tcu::Matrix<tcu::Interval,_3,_3>::Matrix(Matrix<tcu::Interval,_3,_3> *this)

{
  double *pdVar1;
  long lVar2;
  Vector<tcu::Interval,_3> *pVVar3;
  long lVar4;
  undefined8 *puVar5;
  long lVar6;
  int i;
  uint uVar7;
  undefined1 auStack_58 [8];
  undefined8 auStack_50 [10];
  
  lVar2 = 0;
  pVVar3 = (Vector<tcu::Interval,_3> *)this;
  do {
    lVar4 = 0x10;
    do {
      *(undefined1 *)
       ((long)((Vector<tcu::Vector<tcu::Interval,_3>,_3> *)pVVar3->m_data)->m_data[0].m_data +
       lVar4 + -0x10) = 0;
      *(undefined8 *)
       ((long)((Vector<tcu::Vector<tcu::Interval,_3>,_3> *)pVVar3->m_data)->m_data[0].m_data +
       lVar4 + -8) = 0x7ff0000000000000;
      *(undefined8 *)
       (&((Vector<tcu::Vector<tcu::Interval,_3>,_3> *)pVVar3->m_data)->m_data[0].m_data[0].m_hasNaN
       + lVar4) = 0xfff0000000000000;
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x58);
    lVar4 = 0x10;
    do {
      *(undefined1 *)
       ((long)((Vector<tcu::Vector<tcu::Interval,_3>,_3> *)pVVar3->m_data)->m_data[0].m_data +
       lVar4 + -0x10) = 0;
      *(undefined8 *)
       ((long)((Vector<tcu::Vector<tcu::Interval,_3>,_3> *)pVVar3->m_data)->m_data[0].m_data +
       lVar4 + -8) = 0x7ff0000000000000;
      *(undefined8 *)
       (&((Vector<tcu::Vector<tcu::Interval,_3>,_3> *)pVVar3->m_data)->m_data[0].m_data[0].m_hasNaN
       + lVar4) = 0xfff0000000000000;
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x58);
    lVar2 = lVar2 + 0x48;
    pVVar3 = pVVar3 + 1;
  } while (lVar2 != 0xd8);
  lVar2 = 0;
  do {
    lVar4 = 0x10;
    do {
      auStack_58[lVar4] = 0;
      *(undefined8 *)((long)auStack_50 + lVar4) = 0x7ff0000000000000;
      *(undefined8 *)((long)auStack_50 + lVar4 + 8) = 0xfff0000000000000;
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x58);
    lVar4 = 0x10;
    do {
      auStack_58[lVar4] = 0;
      *(undefined8 *)((long)auStack_50 + lVar4) = 0x7ff0000000000000;
      *(undefined8 *)((long)auStack_50 + lVar4 + 8) = 0xfff0000000000000;
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x58);
    pVVar3 = (this->m_data).m_data + lVar2;
    puVar5 = auStack_50;
    for (lVar4 = 9; puVar5 = puVar5 + 1, lVar4 != 0; lVar4 = lVar4 + -1) {
      *(undefined8 *)pVVar3->m_data = *puVar5;
      pVVar3 = (Vector<tcu::Interval,_3> *)&pVVar3->m_data[0].m_lo;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  pdVar1 = &(this->m_data).m_data[0].m_data[0].m_hi;
  lVar2 = 0;
  lVar4 = 0;
  do {
    lVar6 = 0;
    do {
      uVar7 = 0x3ff00000;
      if (lVar2 != lVar6) {
        uVar7 = 0;
      }
      *(undefined1 *)((long)pdVar1 + lVar6 + -0x10) = 0;
      *(ulong *)((long)pdVar1 + lVar6 + -8) = (ulong)uVar7 << 0x20;
      *(ulong *)((long)pdVar1 + lVar6) = (ulong)uVar7 << 0x20;
      lVar6 = lVar6 + 0x48;
    } while (lVar6 != 0xd8);
    lVar4 = lVar4 + 1;
    lVar2 = lVar2 + 0x48;
    pdVar1 = pdVar1 + 3;
  } while (lVar4 != 3);
  return;
}

Assistant:

Matrix<T, Rows, Cols>::Matrix (void)
{
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = (row == col) ? T(1) : T(0);
}